

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void AddNonCompressedBlock
               (ZopfliOptions *options,int final,uchar *in,size_t instart,size_t inend,uchar *bp,
               uchar **out,size_t *outsize)

{
  uchar *puVar1;
  uchar *puVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  uchar *puVar6;
  ulong uVar7;
  
  do {
    uVar5 = (int)instart - (int)in;
    if (in + 0xffff <= instart) {
      uVar5 = 0xffff;
    }
    uVar4 = uVar5 & 0xffff;
    puVar1 = in + uVar4;
    AddBit((uint)(instart <= puVar1 && (int)options != 0),(uchar *)inend,(uchar **)bp,(size_t *)out)
    ;
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    *(undefined1 *)inend = 0;
    puVar6 = *out;
    if (((ulong)puVar6 & (ulong)(puVar6 + -1)) == 0) {
      if (puVar6 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar6 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar6 * 2);
        puVar6 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar6) = (uchar)uVar4;
    puVar2 = *out;
    puVar6 = puVar2 + 1;
    *out = puVar6;
    if (((ulong)puVar6 & (ulong)puVar2) == 0) {
      if (puVar6 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar6 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar6 * 2);
        puVar6 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar6) = (uchar)(uVar4 >> 8);
    puVar2 = *out;
    puVar6 = puVar2 + 1;
    *out = puVar6;
    if (((ulong)puVar6 & (ulong)puVar2) == 0) {
      if (puVar6 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar6 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar6 * 2);
        puVar6 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar6) = (uchar)~uVar5;
    puVar2 = *out;
    puVar6 = puVar2 + 1;
    *out = puVar6;
    if (((ulong)puVar6 & (ulong)puVar2) == 0) {
      if (puVar6 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar6 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar6 * 2);
        puVar6 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar6) = (uchar)(~uVar5 >> 8);
    puVar6 = *out + 1;
    *out = puVar6;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      if (((ulong)puVar6 & (ulong)(puVar6 + -1)) == 0) {
        if (puVar6 == (uchar *)0x0) {
          pvVar3 = malloc(1);
          puVar6 = (uchar *)0x0;
        }
        else {
          pvVar3 = realloc(*(void **)bp,(long)puVar6 * 2);
          puVar6 = *out;
        }
        *(void **)bp = pvVar3;
      }
      else {
        pvVar3 = *(void **)bp;
      }
      *(uchar *)((long)pvVar3 + (long)puVar6) = in[uVar7 + CONCAT44(in_register_00000034,final)];
      puVar6 = *out + 1;
      *out = puVar6;
    }
    in = puVar1;
  } while (puVar1 < instart);
  return;
}

Assistant:

static void AddNonCompressedBlock(const ZopfliOptions* options, int final,
                                  const unsigned char* in, size_t instart,
                                  size_t inend,
                                  unsigned char* bp,
                                  unsigned char** out, size_t* outsize) {
  size_t pos = instart;
  (void)options;
  for (;;) {
    size_t i;
    unsigned short blocksize = 65535;
    unsigned short nlen;
    int currentfinal;

    if (pos + blocksize > inend) blocksize = inend - pos;
    currentfinal = pos + blocksize >= inend;

    nlen = ~blocksize;

    AddBit(final && currentfinal, bp, out, outsize);
    /* BTYPE 00 */
    AddBit(0, bp, out, outsize);
    AddBit(0, bp, out, outsize);

    /* Any bits of input up to the next byte boundary are ignored. */
    *bp = 0;

    ZOPFLI_APPEND_DATA(blocksize % 256, out, outsize);
    ZOPFLI_APPEND_DATA((blocksize / 256) % 256, out, outsize);
    ZOPFLI_APPEND_DATA(nlen % 256, out, outsize);
    ZOPFLI_APPEND_DATA((nlen / 256) % 256, out, outsize);

    for (i = 0; i < blocksize; i++) {
      ZOPFLI_APPEND_DATA(in[pos + i], out, outsize);
    }

    if (currentfinal) break;
    pos += blocksize;
  }
}